

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  BaseType BVar2;
  BaseType BVar3;
  uint32_t uVar4;
  uint uVar5;
  BaseType BVar6;
  uint32_t uVar7;
  byte bVar8;
  BaseType BVar9;
  CompilerError *this_00;
  BaseType BVar10;
  char *pcVar11;
  BaseType BVar12;
  char *pcVar13;
  BaseType BVar14;
  BaseType BVar15;
  BaseType BVar16;
  BaseType BVar17;
  BaseType BVar18;
  BaseType BVar19;
  BaseType BVar20;
  string local_60;
  BaseType local_3c;
  BaseType local_38;
  BaseType local_34;
  
  if ((out_type->pointer != false) || (in_type->pointer == true)) {
    if ((out_type->vecsize == 2) || (in_type->vecsize == 2)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"GL_EXT_buffer_reference_uvec2","");
      require_extension_internal(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
LAB_00339ef2:
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,out_type,0);
    return __return_storage_ptr__;
  }
  BVar2 = out_type->basetype;
  BVar3 = in_type->basetype;
  if (BVar2 == BVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    if (BVar2 == Boolean) {
      __assert_fail("out_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x258c,
                    "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if (BVar3 == Boolean) {
      __assert_fail("in_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x258d,
                    "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if ((BVar2 - SByte < 8) && (BVar3 - SByte < 8)) {
      bVar8 = 1;
      if (out_type->width == in_type->width) goto LAB_00339ef2;
    }
    else {
      bVar8 = 0;
    }
    uVar4 = out_type->width;
    uVar5 = in_type->width;
    BVar6 = in_type->vecsize;
    if ((bool)(BVar6 == Void & 0xf < uVar5 & bVar8 & uVar4 == 8)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpack8";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    uVar7 = out_type->vecsize;
    if ((bool)(uVar7 == 1 & uVar5 == 8 & bVar8 & uVar4 == 0x10)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "pack16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((bool)(bVar8 & uVar5 == 8 & uVar4 == 0x20 & uVar7 == 1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "pack32";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar12 = BVar2 ^ UInt;
    if (BVar12 == Unknown && (BVar3 ^ Float) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Float -> Uint bitcast not supported on legacy ESSL.");
LAB_0033a694:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "floatBitsToUint";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar3 ^ Float) == Unknown && (BVar2 ^ Int) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Float -> Int bitcast not supported on legacy ESSL.");
        goto LAB_0033a694;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "floatBitsToInt";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar14 = BVar3 ^ UInt;
    if ((BVar2 ^ Float) == Unknown && BVar14 == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Uint -> Float bitcast not supported on legacy ESSL.");
        goto LAB_0033a694;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uintBitsToFloat";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar2 ^ Float) == Unknown && (BVar3 ^ Int) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Int -> Float bitcast not supported on legacy ESSL.");
        goto LAB_0033a694;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "intBitsToFloat";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar2 ^ Int64) == Unknown && (BVar3 ^ Double) == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "doubleBitsToInt64";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar15 = BVar2 ^ UInt64;
    if ((BVar3 ^ Double) == Unknown && BVar15 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "doubleBitsToUint64";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar2 ^ Double) == Unknown && (BVar3 ^ Int64) == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "int64BitsToDouble";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar17 = BVar3 ^ UInt64;
    if ((BVar2 ^ Double) == Unknown && BVar17 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uint64BitsToDouble";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    local_38 = BVar2 ^ Short;
    BVar18 = BVar3 ^ Half;
    if (local_38 == Unknown && BVar18 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "float16BitsToInt16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    local_3c = BVar2 ^ UShort;
    if (local_3c == Unknown && BVar18 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "float16BitsToUint16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar10 = BVar2 ^ Half;
    BVar19 = BVar3 ^ Short;
    if (BVar10 == Unknown && BVar19 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "int16BitsToFloat16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar9 = BVar3 ^ UShort;
    if (BVar10 == Unknown && BVar9 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uint16BitsToFloat16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar20 = BVar6 ^ Boolean;
    local_34 = BVar15 | BVar14 | BVar20;
    if (local_34 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint2x32";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if (uVar7 == 2 && (BVar12 == Unknown && BVar17 == Unknown)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackUint2x32";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    BVar16 = BVar6 ^ Void;
    if ((BVar10 == Unknown && BVar14 == Unknown) && BVar16 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackFloat2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar18 == Unknown && BVar12 == Unknown) && BVar20 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packFloat2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if (((BVar2 ^ Int) == Unknown && BVar19 == Unknown) && BVar20 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packInt2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if (((BVar3 ^ Int) == Unknown && local_38 == Unknown) && BVar16 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackInt2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar12 == Unknown && BVar9 == Unknown) && BVar20 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar14 == Unknown && local_3c == Unknown) && BVar16 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackUint2x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if (((BVar2 ^ Int64) == Unknown && BVar19 == Unknown) && (BVar6 ^ UByte) == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packInt4x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((local_38 == Unknown && (BVar3 ^ Int64) == Unknown) && BVar16 == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackInt4x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    if ((BVar15 == Unknown && BVar9 == Unknown) && (BVar6 ^ UByte) == Unknown) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint4x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((local_3c == Unknown && BVar17 == Unknown) && BVar16 == Unknown) {
      pcVar13 = "unpackUint4x16";
      pcVar11 = "";
      goto LAB_0033a661;
    }
  }
  pcVar11 = "";
  pcVar13 = "";
LAB_0033a661:
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar13,pcVar11);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}